

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultShaderSourceStreamFactory.cpp
# Opt level: O0

void __thiscall
Diligent::DefaultShaderSourceStreamFactory::CreateInputStream2
          (DefaultShaderSourceStreamFactory *this,Char *Name,
          CREATE_SHADER_SOURCE_INPUT_STREAM_FLAGS Flags,IFileStream **ppStream)

{
  bool bVar1;
  CREATE_SHADER_SOURCE_INPUT_STREAM_FLAGS CVar2;
  BasicFileStream *pBVar3;
  char *local_b8;
  RefCntAutoPtr<Diligent::BasicFileStream> local_98;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> FullPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *SearchDir;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  RefCntAutoPtr<Diligent::BasicFileStream> local_38;
  RefCntAutoPtr<Diligent::BasicFileStream> pFileStream;
  anon_class_1_0_00000001 CreateFileStream;
  IFileStream **ppStream_local;
  Char *pCStack_18;
  CREATE_SHADER_SOURCE_INPUT_STREAM_FLAGS Flags_local;
  Char *Name_local;
  DefaultShaderSourceStreamFactory *this_local;
  
  pCStack_18 = Name;
  Name_local = (Char *)this;
  RefCntAutoPtr<Diligent::BasicFileStream>::RefCntAutoPtr(&local_38);
  bVar1 = BasicFileSystem::IsPathAbsolute(pCStack_18);
  if (bVar1) {
    CreateInputStream2::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&__range2,(char *)((long)&pFileStream.m_pObject + 7));
    RefCntAutoPtr<Diligent::BasicFileStream>::operator=
              (&local_38,(RefCntAutoPtr<Diligent::BasicFileStream> *)&__range2);
    RefCntAutoPtr<Diligent::BasicFileStream>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::BasicFileStream> *)&__range2);
  }
  else {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->m_SearchDirectories);
    SearchDir = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&this->m_SearchDirectories);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&SearchDir), bVar1) {
      FullPath.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      if ((*pCStack_18 == '\\') || (*pCStack_18 == '/')) {
        local_b8 = pCStack_18 + 1;
      }
      else {
        local_b8 = pCStack_18;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FullPath.field_2._8_8_,local_b8);
      std::__cxx11::string::c_str();
      CreateInputStream2::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&local_98,(char *)((long)&pFileStream.m_pObject + 7));
      RefCntAutoPtr<Diligent::BasicFileStream>::operator=(&local_38,&local_98);
      RefCntAutoPtr<Diligent::BasicFileStream>::~RefCntAutoPtr(&local_98);
      bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&local_38);
      std::__cxx11::string::~string((string *)local_90);
      if (bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&local_38);
  if (bVar1) {
    pBVar3 = RefCntAutoPtr<Diligent::BasicFileStream>::operator->(&local_38);
    (**(pBVar3->super_ObjectBase<Diligent::IFileStream>).
       super_RefCountedObject<Diligent::IFileStream>.super_IFileStream.super_IObject._vptr_IObject)
              (pBVar3,IID_FileStream,ppStream);
  }
  else {
    *ppStream = (IFileStream *)0x0;
    CVar2 = Diligent::operator&(Flags,CREATE_SHADER_SOURCE_INPUT_STREAM_FLAG_SILENT);
    if (CVar2 == CREATE_SHADER_SOURCE_INPUT_STREAM_FLAG_NONE) {
      LogError<false,char[47],char_const*>
                (false,"CreateInputStream2",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DefaultShaderSourceStreamFactory.cpp"
                 ,0x76,(char (*) [47])"Failed to create input stream for source file ",
                 &stack0xffffffffffffffe8);
    }
  }
  RefCntAutoPtr<Diligent::BasicFileStream>::~RefCntAutoPtr(&local_38);
  return;
}

Assistant:

void DefaultShaderSourceStreamFactory::CreateInputStream2(const Char*                             Name,
                                                          CREATE_SHADER_SOURCE_INPUT_STREAM_FLAGS Flags,
                                                          IFileStream**                           ppStream)
{
    auto CreateFileStream = [](const char* Path) //
    {
        RefCntAutoPtr<BasicFileStream> pFileStream;
        if (FileSystem::FileExists(Path))
        {
            pFileStream = BasicFileStream::Create(Path, EFileAccessMode::Read);
            if (!pFileStream->IsValid())
                pFileStream.Release();
        }
        return pFileStream;
    };

    RefCntAutoPtr<BasicFileStream> pFileStream;
    if (FileSystem::IsPathAbsolute(Name))
    {
        pFileStream = CreateFileStream(Name);
    }
    else
    {
        for (const auto& SearchDir : m_SearchDirectories)
        {
            const auto FullPath = SearchDir + ((Name[0] == '\\' || Name[0] == '/') ? Name + 1 : Name);
            pFileStream         = CreateFileStream(FullPath.c_str());
            if (pFileStream)
                break;
        }
    }

    if (pFileStream)
    {
        pFileStream->QueryInterface(IID_FileStream, reinterpret_cast<IObject**>(ppStream));
    }
    else
    {
        *ppStream = nullptr;
        if ((Flags & CREATE_SHADER_SOURCE_INPUT_STREAM_FLAG_SILENT) == 0)
        {
            LOG_ERROR("Failed to create input stream for source file ", Name);
        }
    }
}